

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_816ce2::GetIndexArg(string *arg,int *idx,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string msg;
  long value;
  string local_d0;
  string local_b0;
  int local_90 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  
  bVar1 = cmStrToLong(arg,(long *)local_90);
  if (!bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0121,false);
    if (PVar2 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_b0,(cmPolicies *)0x79,id);
      local_88.first._M_len = local_b0._M_string_length;
      local_88.first._M_str = local_b0._M_dataplus._M_p;
      local_70 = 0x15;
      local_68 = " Invalid list index \"";
      local_60 = 0;
      local_50 = (arg->_M_dataplus)._M_p;
      local_58 = arg->_M_string_length;
      local_48 = 0;
      local_40 = 2;
      local_38 = "\".";
      local_30 = 0;
      views_00._M_len = 4;
      views_00._M_array = &local_88;
      local_88.second = &local_b0;
      cmCatViews(&local_d0,views_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_d0);
    }
    else {
      if (PVar2 == NEW) {
        return false;
      }
      if (PVar2 != WARN) goto LAB_0026dfae;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b0,(cmPolicies *)0x79,id);
      local_88.first._M_len = local_b0._M_string_length;
      local_88.first._M_str = local_b0._M_dataplus._M_p;
      local_70 = 0x15;
      local_68 = " Invalid list index \"";
      local_60 = 0;
      local_50 = (arg->_M_dataplus)._M_p;
      local_58 = arg->_M_string_length;
      local_48 = 0;
      local_40 = 2;
      local_38 = "\".";
      local_30 = 0;
      views._M_len = 4;
      views._M_array = &local_88;
      local_88.second = &local_b0;
      cmCatViews(&local_d0,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0026dfae:
  *idx = local_90[0];
  return true;
}

Assistant:

bool GetIndexArg(const std::string& arg, int* idx, cmMakefile& mf)
{
  long value;
  if (!cmStrToLong(arg, &value)) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0121)) {
      case cmPolicies::WARN: {
        // Default is to warn and use old behavior OLD behavior is to allow
        // compatibility, so issue a warning and use the previous behavior.
        std::string warn =
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::AUTHOR_WARNING, warn);
        CM_FALLTHROUGH;
      }
      case cmPolicies::OLD:
        // OLD behavior is to allow compatibility, so just ignore the
        // situation.
        break;
      case cmPolicies::NEW:
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        std::string msg =
          cmStrCat(cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::FATAL_ERROR, msg);
        break;
    }
  }

  // Truncation is happening here, but it had always been happening here.
  *idx = static_cast<int>(value);

  return true;
}